

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NodeSplitLarge(Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pFanin_00;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  
  iVar1 = (pNode->vFanins).nSize;
  uVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
  pFanin = Abc_NtkDupObj(pNode->pNtk,pNode,0);
  pFanin_00 = Abc_NtkDupObj(pNode->pNtk,pNode,0);
  for (lVar5 = 0; uVar3 = (ulong)(pNode->vFanins).nSize, lVar5 < (long)uVar3; lVar5 = lVar5 + 1) {
    Abc_ObjAddFanin(pFanin,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]]);
  }
  for (lVar5 = 0; lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
    Abc_ObjAddFanin(pFanin_00,
                    (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]]);
    uVar3 = (ulong)(uint)(pNode->vFanins).nSize;
  }
  Abc_ObjRemoveFanins(pNode);
  Abc_ObjAddFanin(pNode,pFanin);
  Abc_ObjAddFanin(pNode,pFanin_00);
  pcVar4 = Abc_SopCreateOr((Mem_Flex_t *)pNode->pNtk->pManFunc,2,(int *)0x0);
  (pNode->field_5).pData = pcVar4;
  if (1 < (int)uVar2) {
    lVar5 = (ulong)(uVar2 >> 1) * ((long)iVar1 + 3);
    *(undefined1 *)((long)(pFanin->field_5).pData + lVar5) = 0;
    (pFanin_00->field_5).pData = (void *)((long)(pFanin_00->field_5).pData + lVar5);
    return;
  }
  __assert_fail("nCubes > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                ,0x19e,"void Abc_NodeSplitLarge(Abc_Obj_t *)");
}

Assistant:

void Abc_NodeSplitLarge( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode1, * pNode2, * pFanin;
    int CutPoint, nVars = Abc_ObjFaninNum(pNode);
    int i, nCubes = Abc_SopGetCubeNum((char *)pNode->pData);
    pNode1 = Abc_NtkDupObj( pNode->pNtk, pNode, 0 );
    pNode2 = Abc_NtkDupObj( pNode->pNtk, pNode, 0 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_ObjAddFanin( pNode1, pFanin );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_ObjAddFanin( pNode2, pFanin );    
    // update the node
    Abc_ObjRemoveFanins( pNode );
    Abc_ObjAddFanin( pNode, pNode1 );
    Abc_ObjAddFanin( pNode, pNode2 );
    pNode->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNode->pNtk->pManFunc, 2, NULL );
    // update covers of the nodes
    assert( nCubes > 1 );
    CutPoint = (nCubes / 2) * (nVars + 3);
    ((char *)pNode1->pData)[CutPoint] = 0;
    pNode2->pData = (char *)pNode2->pData + CutPoint;
}